

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasCommit(Canvas *ptr)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  float fVar6;
  undefined1 auVar7 [16];
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  
  auVar7 = _DAT_001d83c0;
  if (ptr != (Canvas *)0x0) {
    pcVar4 = (ptr->data).ptr;
    pcVar5 = (ptr->dataI).ptr;
    iVar2 = ptr->width;
    iVar3 = ptr->height;
    fVar9 = (float)DAT_001d83c0;
    fVar10 = DAT_001d83c0._4_4_;
    fVar11 = DAT_001d83c0._8_4_;
    fVar12 = DAT_001d83c0._12_4_;
    for (lVar8 = 0; (long)iVar3 * (long)iVar2 * 4 != lVar8; lVar8 = lVar8 + 4) {
      fVar13 = *(float *)(pcVar4 + lVar8 * 4 + 8) * 255.0;
      fVar6 = 255.0;
      if (fVar13 <= 255.0) {
        fVar6 = fVar13;
      }
      uVar1 = *(undefined8 *)(pcVar4 + lVar8 * 4);
      fVar14 = (float)uVar1 * fVar9;
      fVar15 = (float)((ulong)uVar1 >> 0x20) * fVar10;
      auVar16._4_4_ = fVar15;
      auVar16._0_4_ = fVar14;
      auVar16._8_4_ = fVar11 * 0.0;
      auVar16._12_4_ = fVar12 * 0.0;
      auVar16 = minps(auVar7,auVar16);
      *(uint *)(pcVar5 + lVar8) =
           (int)(float)(-(uint)(0.0 <= fVar15) & auVar16._4_4_) << 8 |
           (int)(float)(-(uint)(0.0 <= fVar14) & auVar16._0_4_) << 0x10 |
           (int)(float)(~-(uint)(fVar13 < 0.0) & (uint)fVar6) | 0xff000000;
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasCommit(Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		int *pStart = (int*)ptr->dataI.ptr, *pEnd = (int*)ptr->dataI.ptr + ptr->width * ptr->height;
		float *fStart = (float*)ptr->data.ptr;
		for(int *pix = pStart; pix != pEnd; pix++)
		{
			int red = int(saturate(*fStart++ * 255.0f));
			int green = int(saturate(*fStart++ * 255.0f));
			int blue = int(saturate(*fStart++ * 255.0f));
			fStart++;

			*pix = (red << 16) | (green << 8) | (blue) | (255 << 24);
		}
	}